

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Dtc_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvCutsXor2,Vec_Int_t **pvCutsXor,
                       Vec_Int_t **pvCutsMaj,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vCutsXor;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar4;
  int *pList0;
  int *pList1;
  uint uVar5;
  
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManAndNum(p);
  p_01 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManAndNum(p);
  vCutsXor = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManAndNum(p);
  vCutsMaj = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManAndNum(p);
  p_02 = Vec_IntAlloc(iVar1 * 0x1e);
  Vec_IntFill(p_02,p->nObjs,0);
  Gia_ManCleanValue(p);
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCi(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pGVar4);
    Vec_IntWriteEntry(p_02,iVar2,p_02->nSize);
    Vec_IntPush(p_02,1);
    Vec_IntPush(p_02,1);
    iVar2 = Gia_ObjId(p,pGVar4);
    Vec_IntPush(p_02,iVar2);
  }
  uVar5 = 0;
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(undefined8 *)pGVar4;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      iVar2 = Vec_IntEntry(p_02,iVar1 - (uVar3 & 0x1fffffff));
      pList0 = Vec_IntEntryP(p_02,iVar2);
      iVar2 = Vec_IntEntry(p_02,iVar1 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
      pList1 = Vec_IntEntryP(p_02,iVar2);
      Dtc_ManCutMerge(p,iVar1,pList0,pList1,p_00,p_01,vCutsXor,vCutsMaj);
      Vec_IntWriteEntry(p_02,iVar1,p_02->nSize);
      Vec_IntAppend(p_02,p_00);
      iVar2 = Vec_IntEntry(p_00,0);
      uVar5 = uVar5 + iVar2;
    }
  }
  if (fVerbose != 0) {
    uVar3 = Gia_ManAndNum(p);
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           (double)(int)uVar5 / (double)(int)uVar3,(double)p_02->nSize / (double)(int)uVar3,
           (ulong)uVar3,(ulong)uVar5);
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_02);
  if (pvCutsXor2 == (Vec_Int_t **)0x0) {
    Vec_IntFree(p_01);
  }
  else {
    *pvCutsXor2 = p_01;
  }
  *pvCutsXor = vCutsXor;
  *pvCutsMaj = vCutsMaj;
  return;
}

Assistant:

void Dtc_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvCutsXor2, Vec_Int_t ** pvCutsXor, Vec_Int_t ** pvCutsMaj, int fVerbose )
{
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCutsXor2 = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsXor = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsMaj = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Dtc_ManCutMerge( p, i, pList0, pList1, vTemp, vCutsXor2, vCutsXor, vCutsMaj );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    if ( pvCutsXor2 )
        *pvCutsXor2 = vCutsXor2;
    else
        Vec_IntFree( vCutsXor2 );
    *pvCutsXor = vCutsXor;
    *pvCutsMaj = vCutsMaj;
}